

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef17::ProcRand(uchar *out,int num,RNGLevel level,bool always_use_real_rng)

{
  long lVar1;
  bool bVar2;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  RNGState *rng;
  CSHA512 startup_hasher;
  CSHA512 hasher;
  CSHA512 *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  CSHA512 *in_stack_fffffffffffffe80;
  RNGState *in_stack_fffffffffffffe88;
  CSHA512 *in_stack_fffffffffffffe90;
  RNGState *in_stack_fffffffffffffe98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetRNGState();
  if (0x20 < in_ESI) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                  ,0x282,
                  "void (anonymous namespace)::ProcRand(unsigned char *, int, RNGLevel, bool)");
  }
  CSHA512::CSHA512(in_stack_fffffffffffffe38);
  if (in_EDX == 0) {
    SeedFast((CSHA512 *)0x20e66f);
  }
  else if (in_EDX == 1) {
    SeedSlow(in_stack_fffffffffffffe38,(RNGState *)0x20e683);
  }
  else if (in_EDX == 2) {
    SeedPeriodic(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  bVar2 = RNGState::MixExtract
                    (in_stack_fffffffffffffe98,(uchar *)in_stack_fffffffffffffe90,
                     (size_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     (bool)in_stack_fffffffffffffe7f,(bool)in_stack_fffffffffffffe7e);
  if (!bVar2) {
    CSHA512::CSHA512(in_stack_fffffffffffffe38);
    SeedStartup(in_stack_fffffffffffffe80,
                (RNGState *)
                CONCAT17(in_stack_fffffffffffffe7f,
                         CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)));
    RNGState::MixExtract
              (in_stack_fffffffffffffe98,(uchar *)in_stack_fffffffffffffe90,
               (size_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (bool)in_stack_fffffffffffffe7f,(bool)in_stack_fffffffffffffe7e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProcRand(unsigned char* out, int num, RNGLevel level, bool always_use_real_rng) noexcept
{
    // Make sure the RNG is initialized first (as all Seed* function possibly need hwrand to be available).
    RNGState& rng = GetRNGState();

    assert(num <= 32);

    CSHA512 hasher;
    switch (level) {
    case RNGLevel::FAST:
        SeedFast(hasher);
        break;
    case RNGLevel::SLOW:
        SeedSlow(hasher, rng);
        break;
    case RNGLevel::PERIODIC:
        SeedPeriodic(hasher, rng);
        break;
    }

    // Combine with and update state
    if (!rng.MixExtract(out, num, std::move(hasher), false, always_use_real_rng)) {
        // On the first invocation, also seed with SeedStartup().
        CSHA512 startup_hasher;
        SeedStartup(startup_hasher, rng);
        rng.MixExtract(out, num, std::move(startup_hasher), true, always_use_real_rng);
    }
}